

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

void tro_print_keys(trt_tree_ctx *tc,ly_out *out)

{
  undefined8 in_RAX;
  lysp_node *plVar1;
  
  if (tc->lysc_tree == '\0') {
    plVar1 = tc->pn;
  }
  else {
    plVar1 = (lysp_node *)tc->cn->priv;
    if (plVar1 == (lysp_node *)0x0) {
      __assert_fail("TRP_TREE_CTX_LYSP_NODE_PRESENT(tc->cn)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                    ,0x98e,"void tro_print_keys(const struct trt_tree_ctx *, struct ly_out *)");
    }
  }
  if ((plVar1->nodetype & 0x10) != 0) {
    plVar1 = plVar1[1].next;
    if ((plVar1 != (lysp_node *)0x0) && (*(char *)&plVar1->parent != '\0')) {
      ly_print_(out,"%s",plVar1,in_RAX);
      return;
    }
    return;
  }
  __assert_fail("list->nodetype & LYS_LIST",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0x993,"void tro_print_keys(const struct trt_tree_ctx *, struct ly_out *)");
}

Assistant:

static void
tro_print_keys(const struct trt_tree_ctx *tc, struct ly_out *out)
{
    const struct lysp_node_list *list;

    if (tc->lysc_tree) {
        assert(TRP_TREE_CTX_LYSP_NODE_PRESENT(tc->cn));
        list = (const struct lysp_node_list *)TRP_TREE_CTX_GET_LYSP_NODE(tc->cn);
    } else {
        list = (const struct lysp_node_list *)tc->pn;
    }
    assert(list->nodetype & LYS_LIST);

    if (trg_charptr_has_data(list->key)) {
        ly_print_(out, "%s", list->key);
    }
}